

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsettings.cpp
# Opt level: O0

void __thiscall QSettings::endArray(QSettings *this)

{
  bool bVar1;
  QSettingsPrivate *pQVar2;
  ulong uVar3;
  qsizetype qVar4;
  QSettings *this_00;
  __off_t __length;
  long in_FS_OFFSET;
  qsizetype len;
  QSettingsPrivate *d;
  QSettingsGroup group;
  QSettingsGroup *in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe34;
  undefined7 in_stack_fffffffffffffe38;
  undefined1 in_stack_fffffffffffffe3f;
  QAnyStringView *in_stack_fffffffffffffe40;
  QVariant *value;
  QSettingsGroup *in_stack_fffffffffffffe60;
  QString *this_01;
  QAnyStringView in_stack_fffffffffffffeb0;
  undefined1 local_130 [88];
  QString local_90;
  QSettingsGroup local_78;
  QMessageLogger local_48;
  QAnyStringView local_28 [2];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QSettings *)0x7b2fb6);
  bVar1 = QList<QSettingsGroup>::isEmpty((QList<QSettingsGroup> *)0x7b2fcc);
  if (bVar1) {
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffe40,
               (char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
               in_stack_fffffffffffffe34,(char *)in_stack_fffffffffffffe28);
    QMessageLogger::warning(&local_48,"QSettings::endArray: No matching beginArray()");
  }
  else {
    local_78.str.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.str.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_78.str.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.num = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_78.maxNum = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QStack<QSettingsGroup>::top((QStack<QSettingsGroup> *)0x7b3065);
    QSettingsGroup::QSettingsGroup
              ((QSettingsGroup *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
    QSettingsGroup::toString(in_stack_fffffffffffffe60);
    uVar3 = QString::size(&local_90);
    QString::~QString((QString *)0x7b30af);
    QStack<QSettingsGroup>::pop((QStack<QSettingsGroup> *)in_stack_fffffffffffffe28);
    QSettingsGroup::~QSettingsGroup((QSettingsGroup *)0x7b30e1);
    if (0 < (long)uVar3) {
      this_01 = &pQVar2->groupPrefix;
      qVar4 = QString::size(this_01);
      QString::truncate(this_01,(char *)(~uVar3 + qVar4),__length);
    }
    this_00 = (QSettings *)QSettingsGroup::arraySizeGuess(&local_78);
    if (this_00 != (QSettings *)0xffffffffffffffff) {
      QSettingsGroup::name(in_stack_fffffffffffffe28);
      local_130._24_16_ =
           (undefined1  [16])
           Qt::Literals::StringLiterals::operator____L1
                     ((char *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                      CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      ::operator+((QString *)CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                  (QLatin1String *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      value = (QVariant *)local_130;
      QString::QString((QString *)0x7b31bb);
      QAnyStringView::QAnyStringView<QStringBuilder<QString,_QLatin1String>,_true>
                (in_stack_fffffffffffffe40,
                 (QStringBuilder<QString,_QLatin1String> *)
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38),
                 (wrapped_t<QStringBuilder<QString,_QLatin1String>,_QString> *)
                 CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      QSettingsGroup::arraySizeGuess(&local_78);
      in_stack_fffffffffffffe40 = local_28;
      ::QVariant::QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                 CONCAT17(in_stack_fffffffffffffe3f,in_stack_fffffffffffffe38));
      setValue(this_00,in_stack_fffffffffffffeb0,value);
      ::QVariant::~QVariant
                ((QVariant *)CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30));
      QString::~QString((QString *)0x7b323d);
      QStringBuilder<QString,_QLatin1String>::~QStringBuilder
                ((QStringBuilder<QString,_QLatin1String> *)0x7b324a);
      QString::~QString((QString *)0x7b3257);
    }
    bVar1 = QSettingsGroup::isArray(&local_78);
    if (!bVar1) {
      QMessageLogger::QMessageLogger
                ((QMessageLogger *)in_stack_fffffffffffffe40,
                 (char *)CONCAT17(bVar1,in_stack_fffffffffffffe38),in_stack_fffffffffffffe34,
                 (char *)in_stack_fffffffffffffe28);
      QMessageLogger::warning
                ((QMessageLogger *)&stack0xfffffffffffffeb0,
                 "QSettings::endArray: Expected endGroup() instead");
    }
    QSettingsGroup::~QSettingsGroup((QSettingsGroup *)0x7b3323);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSettings::endArray()
{
    Q_D(QSettings);
    if (d->groupStack.isEmpty()) {
        qWarning("QSettings::endArray: No matching beginArray()");
        return;
    }

    QSettingsGroup group = d->groupStack.top();
    qsizetype len = group.toString().size();
    d->groupStack.pop();
    if (len > 0)
        d->groupPrefix.truncate(d->groupPrefix.size() - (len + 1));

    if (group.arraySizeGuess() != -1)
        setValue(group.name() + "/size"_L1, group.arraySizeGuess());

    if (!group.isArray())
        qWarning("QSettings::endArray: Expected endGroup() instead");
}